

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

void Aig_ManChoiceConstructiveOne(Aig_Man_t *pNew,Aig_Man_t *pPrev,Aig_Man_t *pThis)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *p1;
  int local_34;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pThis_local;
  Aig_Man_t *pPrev_local;
  Aig_Man_t *pNew_local;
  
  iVar1 = Aig_ManCiNum(pNew);
  iVar2 = Aig_ManCiNum(pPrev);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(pPrev)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5ca,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  iVar1 = Aig_ManCiNum(pNew);
  iVar2 = Aig_ManCiNum(pThis);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCiNum(pNew) == Aig_ManCiNum(pThis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cb,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  iVar1 = Aig_ManCoNum(pNew);
  iVar2 = Aig_ManCoNum(pPrev);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCoNum(pNew) == Aig_ManCoNum(pPrev)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cc,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  iVar1 = Aig_ManCoNum(pNew);
  iVar2 = Aig_ManCoNum(pThis);
  if (iVar1 != iVar2) {
    __assert_fail("Aig_ManCoNum(pNew) == Aig_ManCoNum(pThis)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                  ,0x5cd,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)")
    ;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(pNew->vObjs), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar3 = Vec_PtrEntry(pNew->vObjs,local_34);
    if (pvVar3 != (void *)0x0) {
      *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf | 0x20;
    }
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(pPrev->vObjs);
    if (iVar1 <= local_34) {
      for (local_34 = 0; iVar1 = Vec_PtrSize(pNew->vObjs), local_34 < iVar1; local_34 = local_34 + 1
          ) {
        pvVar3 = Vec_PtrEntry(pNew->vObjs,local_34);
        if (pvVar3 != (void *)0x0) {
          *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf;
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(pPrev->vObjs), local_34 < iVar1;
          local_34 = local_34 + 1) {
        pvVar3 = Vec_PtrEntry(pPrev->vObjs,local_34);
        if (pvVar3 != (void *)0x0) {
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf | 0x20;
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(pPrev->vObjs), local_34 < iVar1;
          local_34 = local_34 + 1) {
        pvVar3 = Vec_PtrEntry(pPrev->vObjs,local_34);
        if (pvVar3 != (void *)0x0) {
          *(ulong *)((long)pvVar3 + 0x18) = *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf;
        }
      }
      pAVar4 = Aig_ManConst1(pThis);
      pAVar5 = Aig_ManConst1(pNew);
      (pAVar4->field_5).pData = pAVar5;
      for (local_34 = 0; iVar1 = Vec_PtrSize(pThis->vCis), local_34 < iVar1; local_34 = local_34 + 1
          ) {
        pvVar3 = Vec_PtrEntry(pThis->vCis,local_34);
        pAVar4 = Aig_ManCi(pNew,local_34);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(pThis->vCos), local_34 < iVar1; local_34 = local_34 + 1
          ) {
        pvVar3 = Vec_PtrEntry(pThis->vCos,local_34);
        pAVar4 = Aig_ManCo(pNew,local_34);
        *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar4;
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(pThis->vObjs), local_34 < iVar1;
          local_34 = local_34 + 1) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pThis->vObjs,local_34);
        if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
          pAVar5 = Aig_ObjChild0Copy(pAVar4);
          p1 = Aig_ObjChild1Copy(pAVar4);
          pAVar5 = Aig_And(pNew,pAVar5,p1);
          (pAVar4->field_5).pData = pAVar5;
        }
      }
      for (local_34 = 0; iVar1 = Vec_PtrSize(pThis->vCos), local_34 < iVar1; local_34 = local_34 + 1
          ) {
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(pThis->vCos,local_34);
        pAVar5 = Aig_ManCo(pNew,local_34);
        pAVar5 = Aig_ObjFanin0(pAVar5);
        pAVar4 = Aig_ObjFanin0(pAVar4);
        pAVar4 = Aig_Regular((Aig_Obj_t *)(pAVar4->field_5).pData);
        Aig_ObjSetRepr_(pNew,pAVar5,pAVar4);
      }
      return;
    }
    pvVar3 = Vec_PtrEntry(pPrev->vObjs,local_34);
    if ((pvVar3 != (void *)0x0) &&
       (pAVar4 = Aig_Regular(*(Aig_Obj_t **)((long)pvVar3 + 0x28)),
       (*(ulong *)&pAVar4->field_0x18 >> 5 & 1) == 0)) break;
    local_34 = local_34 + 1;
  }
  __assert_fail("Aig_Regular((Aig_Obj_t *)pObj->pData)->fMarkB",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigPart.c"
                ,0x5d2,"void Aig_ManChoiceConstructiveOne(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *)");
}

Assistant:

void Aig_ManChoiceConstructiveOne( Aig_Man_t * pNew, Aig_Man_t * pPrev, Aig_Man_t * pThis )
{
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(pPrev) );
    assert( Aig_ManCiNum(pNew) == Aig_ManCiNum(pThis) );
    assert( Aig_ManCoNum(pNew) == Aig_ManCoNum(pPrev) );
    assert( Aig_ManCoNum(pNew) == Aig_ManCoNum(pThis) );
    // make sure the nodes of pPrev point to pNew
    Aig_ManForEachObj( pNew, pObj, i )
        pObj->fMarkB = 1;
    Aig_ManForEachObj( pPrev, pObj, i )
        assert( Aig_Regular((Aig_Obj_t *)pObj->pData)->fMarkB );
    Aig_ManForEachObj( pNew, pObj, i )
        pObj->fMarkB = 0;
    // make sure the nodes of pThis point to pPrev
    Aig_ManForEachObj( pPrev, pObj, i )
        pObj->fMarkB = 1;
    Aig_ManForEachObj( pPrev, pObj, i )
        pObj->fMarkB = 0;
    // remap nodes of pThis on top of pNew using pPrev
    pObj = Aig_ManConst1(pThis);
    pObj->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( pThis, pObj, i )
        pObj->pData = Aig_ManCi(pNew, i);
    Aig_ManForEachCo( pThis, pObj, i )
        pObj->pData = Aig_ManCo(pNew, i);
    // go through the nodes in the topological order
    Aig_ManForEachNode( pThis, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // set the inputs of POs as equivalent
    Aig_ManForEachCo( pThis, pObj, i )
    {
        pObjNew = Aig_ObjFanin0( Aig_ManCo(pNew,i) );
        // pObjNew and Aig_ObjFanin0(pObj)->pData are equivalent
        Aig_ObjSetRepr_( pNew, pObjNew, Aig_Regular((Aig_Obj_t *)Aig_ObjFanin0(pObj)->pData) );
    }
}